

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O0

void select_colors(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize,int desired_colors)

{
  int iVar1;
  boxptr boxp;
  int local_38;
  int i;
  int numboxes;
  boxptr boxlist;
  int desired_colors_local;
  my_cquantize_ptr cquantize_local;
  gdImagePtr nim_local;
  gdImagePtr oim_local;
  
  iVar1 = overflow2(desired_colors,0x28);
  if ((iVar1 == 0) && (boxp = (boxptr)gdMalloc((long)desired_colors * 0x28), boxp != (boxptr)0x0)) {
    boxp->c0min = 0;
    boxp->c0max = 0x1f;
    boxp->c1min = 0;
    boxp->c1max = 0x3f;
    boxp->c2min = 0;
    boxp->c2max = 0x1f;
    update_box(oim,nim,cquantize,boxp);
    iVar1 = median_cut(oim,nim,cquantize,boxp,1,desired_colors);
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      compute_color(oim,nim,cquantize,boxp + local_38,local_38);
    }
    nim->colorsTotal = iVar1;
    if (-1 < oim->transparent) {
      nim->red[nim->colorsTotal] = (int)(oim->transparent & 0xff0000U) >> 0x10;
      nim->green[nim->colorsTotal] = (int)(oim->transparent & 0xff00U) >> 8;
      nim->blue[nim->colorsTotal] = oim->transparent & 0xff;
      nim->alpha[nim->colorsTotal] = 0x7f;
      nim->open[nim->colorsTotal] = 0;
    }
    gdFree(boxp);
  }
  return;
}

Assistant:

LOCAL (void)
select_colors (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize, int desired_colors)
/* Master routine for color selection */
{
	boxptr boxlist;
	int numboxes;
	int i;

	/* Allocate workspace for box list */
	/* This can't happen because we clamp desired_colors at gdMaxColors,
	  but anyway */
	if (overflow2(desired_colors, sizeof (box))) {
		return;
	}
	boxlist = (boxptr) gdMalloc (desired_colors * sizeof (box));
	if (!boxlist) {
		return;
	}
	/* Initialize one box containing whole space */
	numboxes = 1;
	boxlist[0].c0min = 0;
	boxlist[0].c0max = MAXJSAMPLE >> C0_SHIFT;
	boxlist[0].c1min = 0;
	boxlist[0].c1max = MAXJSAMPLE >> C1_SHIFT;
	boxlist[0].c2min = 0;
	boxlist[0].c2max = MAXJSAMPLE >> C2_SHIFT;
	/* Shrink it to actually-used volume and set its statistics */
	update_box (oim, nim, cquantize, &boxlist[0]);
	/* Perform median-cut to produce final box list */
	numboxes = median_cut (oim, nim, cquantize, boxlist, numboxes, desired_colors);
	/* Compute the representative color for each box, fill colormap */
	for (i = 0; i < numboxes; i++)
		compute_color (oim, nim, cquantize, &boxlist[i], i);
	nim->colorsTotal = numboxes;

	/* If we had a pure transparency color, add it as the last palette entry.
	 * Skip incrementing the color count so that the dither / matching phase
	 * won't use it on pixels that shouldn't have been transparent.  We'll
	 * increment it after all that finishes. */
	if (oim->transparent >= 0) {
		/* Save the transparent color. */
		nim->red[nim->colorsTotal] = gdTrueColorGetRed (oim->transparent);
		nim->green[nim->colorsTotal] = gdTrueColorGetGreen (oim->transparent);
		nim->blue[nim->colorsTotal] = gdTrueColorGetBlue (oim->transparent);
		nim->alpha[nim->colorsTotal] = gdAlphaTransparent;
		nim->open[nim->colorsTotal] = 0;
	}

	gdFree (boxlist);
}